

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper_tests.cpp
# Opt level: O2

void __thiscall dbwrapper_tests::unicodepath::test_method(unicodepath *this)

{
  long lVar1;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  check_type cVar2;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  lazy_ostream local_198;
  undefined1 *local_188;
  char **local_180;
  assertion_result local_178;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  path local_140;
  path lockPath;
  CDBWrapper dbw;
  path local_70;
  path ph;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase((path *)&local_70,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
  fs::operator/(&ph,(path *)&local_70,anon_var_dwarf_5a97d5);
  std::filesystem::__cxx11::path::~path(&local_70);
  std::filesystem::__cxx11::path::path(&lockPath.super_path,&ph.super_path);
  CDBWrapper::CDBWrapper(&dbw,(DBParams *)&lockPath);
  std::filesystem::__cxx11::path::~path(&lockPath.super_path);
  std::filesystem::__cxx11::path::path(&local_140,&ph.super_path);
  fs::operator/(&lockPath,(path *)&local_140,"LOCK");
  std::filesystem::__cxx11::path::~path(&local_140);
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x18f;
  file.m_begin = (iterator)&local_150;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_160,msg);
  local_178.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)std::filesystem::exists(&lockPath.super_path);
  local_178.m_message.px = (element_type *)0x0;
  local_178.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_180 = &local_1a8;
  local_1a8 = "fs::exists(lockPath)";
  local_1a0 = "";
  local_198.m_empty = false;
  local_198._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_1b0 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_178,&local_198,1,0,WARN,_cVar2,(size_t)&local_1b8,399);
  boost::detail::shared_count::~shared_count(&local_178.m_message.pn);
  std::filesystem::__cxx11::path::~path(&lockPath.super_path);
  CDBWrapper::~CDBWrapper(&dbw);
  std::filesystem::__cxx11::path::~path(&ph.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(unicodepath)
{
    // Attempt to create a database with a UTF8 character in the path.
    // On Windows this test will fail if the directory is created using
    // the ANSI CreateDirectoryA call and the code page isn't UTF8.
    // It will succeed if created with CreateDirectoryW.
    fs::path ph = m_args.GetDataDirBase() / "test_runner_₿_🏃_20191128_104644";
    CDBWrapper dbw({.path = ph, .cache_bytes = 1 << 20});

    fs::path lockPath = ph / "LOCK";
    BOOST_CHECK(fs::exists(lockPath));
}